

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

char * __thiscall GenericModel::index(GenericModel *this,char *__s,int __c)

{
  long lVar1;
  undefined8 uVar2;
  uint in_ECX;
  uint *in_R8;
  uint *puVar3;
  
  if (-1 < (int)(in_ECX | __c)) {
    puVar3 = in_R8 + 2;
    if (*(long *)(in_R8 + 4) == 0) {
      puVar3 = (uint *)(*(long *)(__s + 0x10) + 0x10);
    }
    if ((int)(in_R8[1] | *in_R8) < 0) {
      puVar3 = (uint *)(*(long *)(__s + 0x10) + 0x10);
    }
    lVar1 = *(long *)puVar3;
    if ((__c < *(int *)(lVar1 + 0x20)) && ((int)in_ECX < *(int *)(lVar1 + 0x1c))) {
      uVar2 = *(undefined8 *)
               (*(long *)(lVar1 + 0x48) + (long)(int)(*(int *)(lVar1 + 0x1c) * __c + in_ECX) * 8);
      *(int *)this = __c;
      *(uint *)&this->field_0x4 = in_ECX;
      *(undefined8 *)&this->field_0x8 = uVar2;
      this->m_dptr = (GenericModelPrivate *)__s;
      return (char *)this;
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->m_dptr = (GenericModelPrivate *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex GenericModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (row < 0 || column < 0)
        return QModelIndex();
    Q_D(const GenericModel);
    GenericModelItem *parentItem = d->itemForIndex(parent);
    if (row >= parentItem->rowCount() || column >= parentItem->columnCount())
        return QModelIndex();
    return createIndex(row, column, parentItem->childAt(row, column));
}